

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O0

bool anon_unknown.dwarf_9d1d8::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  bool bVar2;
  bool local_26;
  char *str_local;
  char *pattern_local;
  
  cVar1 = *pattern;
  if (cVar1 != '\0') {
    if (cVar1 == '*') {
      if ((*str != '\0') && (bVar2 = PatternMatchesString(pattern,str + 1), bVar2)) {
        return true;
      }
      bVar2 = PatternMatchesString(pattern + 1,str);
      return bVar2;
    }
    if (cVar1 != '-') {
      local_26 = false;
      if (*pattern == *str) {
        local_26 = PatternMatchesString(pattern + 1,str + 1);
      }
      return local_26;
    }
  }
  return *str == '\0';
}

Assistant:

bool PatternMatchesString(const char* pattern, const char* str) {
  switch (*pattern) {
    case '\0':
    case '-': return *str == '\0';
    case '*': return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
                     PatternMatchesString(pattern + 1, str);
    default:  return *pattern == *str &&
                     PatternMatchesString(pattern + 1, str + 1);
  }
}